

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SameValueComparer.h
# Opt level: O1

hash_t Js::SameValueComparerCommon<void_*,_true>::GetHashCode(Var i)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  charcount_t cVar6;
  hash_t hVar7;
  undefined4 *puVar8;
  RecyclableObject *this;
  JavascriptTypedNumber<long> *pJVar9;
  JavascriptString *this_00;
  char16 *pcVar10;
  uint uVar11;
  Type TVar12;
  ulong uVar13;
  double d;
  
  if (i == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00ce63ab;
    *puVar8 = 0;
  }
  uVar13 = (ulong)i & 0xffff000000000000;
  bVar3 = ((ulong)i & 0x1ffff00000000) != 0x1000000000000;
  if (bVar3 && uVar13 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00ce63ab;
    *puVar8 = 0;
  }
  TVar12 = TypeIds_FirstNumberType;
  if ((uVar13 != 0x1000000000000) && (TVar12 = TypeIds_Number, (ulong)i >> 0x32 == 0)) {
    this = UnsafeVarTo<Js::RecyclableObject>(i);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00ce63ab;
      *puVar8 = 0;
    }
    TVar12 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar12) && (BVar5 = RecyclableObject::IsExternal(this), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00ce63ab;
      *puVar8 = 0;
    }
  }
  switch(TVar12) {
  case TypeIds_FirstNumberType:
    if (bVar3 && uVar13 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00ce63ab;
      *puVar8 = 0;
    }
    if (uVar13 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar3) {
LAB_00ce63ab:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    d = (double)(int)i;
    break;
  case TypeIds_Number:
    if ((ulong)i >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar3) goto LAB_00ce63ab;
      *puVar8 = 0;
    }
    d = (double)((ulong)i ^ 0xfffc000000000000);
    break;
  case TypeIds_Int64Number:
  case TypeIds_LastNumberType:
    pJVar9 = VarTo<Js::JavascriptTypedNumber<long>>(i);
    lVar1 = pJVar9->m_value;
    d = (double)lVar1;
    if (lVar1 != (long)d) {
      return (uint)((ulong)lVar1 >> 0x20) ^ (uint)lVar1;
    }
    break;
  case TypeIds_String:
    this_00 = UnsafeVarTo<Js::JavascriptString>(i);
    pcVar10 = JavascriptString::GetString(this_00);
    cVar6 = JavascriptString::GetLength(this_00);
    if (cVar6 != 0) {
      uVar11 = 0x811c9dc5;
      uVar13 = 0;
      do {
        uVar11 = ((ushort)pcVar10[uVar13] ^ uVar11) * 0x1000193;
        uVar13 = uVar13 + 1;
      } while (cVar6 != uVar13);
      return uVar11;
    }
    return 0x811c9dc5;
  default:
    return (hash_t)((ulong)i >> 4);
  }
  hVar7 = HashDouble(d);
  return hVar7;
}

Assistant:

static hash_t GetHashCode(Var i)
        {
            switch (JavascriptOperators::GetTypeId(i))
            {
            case TypeIds_Integer:
                // int32 can be fully represented in a double, so hash it as a double
                // to ensure that tagged ints hash to the same value as JavascriptNumbers.
                return HashDouble((double)TaggedInt::ToInt32(i));

            case TypeIds_Int64Number:
            case TypeIds_UInt64Number:
                {
                    __int64 v = VarTo<JavascriptInt64Number>(i)->GetValue();
                    double d = (double) v;
                    if (v != (__int64) d)
                    {
                        // this int64 is too large to represent in a double
                        // and thus will never be equal to a double so hash it
                        // as an int64
                        return (uint)v ^ (uint)(v >> 32);
                    }

                    // otherwise hash it as a double
                    return HashDouble(d);
                }

            case TypeIds_Number:
                {
                    double d = JavascriptNumber::GetValue(i);
                    return HashDouble(d);
                }

            case TypeIds_String:
                {
                    JavascriptString* v = UnsafeVarTo<JavascriptString>(i);
                    return JsUtil::CharacterBuffer<WCHAR>::StaticGetHashCode(v->GetString(), v->GetLength());
                }

            default:
                return RecyclerPointerComparer<Var>::GetHashCode(i);
            }
        }